

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::test_add_checked(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  
  r = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_add_checked(r,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xab);
  _Var1 = roaring64_bitmap_add_checked(r,0);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xac);
  _Var1 = roaring64_bitmap_add_checked(r,10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 10000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xad);
  _Var1 = roaring64_bitmap_add_checked(r,10000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 10000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xae);
  _Var1 = roaring64_bitmap_add_checked(r,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_add_checked(r, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xaf);
  _Var1 = roaring64_bitmap_add_checked(r,200000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_add_checked(r, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb0);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb3);
  _Var1 = roaring64_bitmap_contains(r,10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 10000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb4);
  _Var1 = roaring64_bitmap_contains(r,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 200000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb5);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_add_checked) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_true(roaring64_bitmap_add_checked(r, 0));
    assert_false(roaring64_bitmap_add_checked(r, 0));
    assert_true(roaring64_bitmap_add_checked(r, 10000));
    assert_false(roaring64_bitmap_add_checked(r, 10000));
    assert_true(roaring64_bitmap_add_checked(r, 200000));
    assert_false(roaring64_bitmap_add_checked(r, 200000));

    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 0));
    assert_true(roaring64_bitmap_contains(r, 10000));
    assert_true(roaring64_bitmap_contains(r, 200000));

    roaring64_bitmap_free(r);
}